

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

double * getMODWTmra(wt_object wt,double *wavecoeffs)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  fft_object obj;
  fft_object fft_bd;
  fft_data *inp;
  fft_data *cA;
  fft_data *cD;
  fft_data *det;
  fft_data *oup;
  fft_data *oup_00;
  int *index;
  double *pdVar5;
  long lVar6;
  fft_data *pfVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  fft_data *high_pass;
  size_t __size;
  ulong uVar13;
  int in_stack_ffffffffffffff58;
  
  uVar11 = wt->modwtsiglength;
  high_pass = (fft_data *)(long)(int)uVar11;
  uVar2 = wt->wave->lpd_len;
  lVar12 = (long)(int)uVar2;
  iVar3 = strcmp(wt->ext,"sym");
  if (iVar3 == 0) {
    uVar4 = (int)uVar11 / 2;
  }
  else {
    strcmp(wt->ext,"per");
    uVar4 = uVar11;
  }
  iVar3 = wt->J;
  obj = fft_init(uVar11,1);
  fft_bd = fft_init(uVar11,-1);
  __size = (long)high_pass << 4;
  inp = (fft_data *)malloc(__size);
  cA = (fft_data *)malloc(__size);
  cD = (fft_data *)malloc(__size);
  det = (fft_data *)malloc(__size);
  oup = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  index = (int *)malloc((long)high_pass * 4);
  pdVar5 = (double *)malloc(((long)iVar3 + 1) * (long)(int)uVar4 * 8);
  lVar6 = 0;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
  }
  for (; uVar13 * 8 != lVar6; lVar6 = lVar6 + 8) {
    *(double *)((long)&inp->re + lVar6 * 2) =
         *(double *)((long)wt->wave->lpd + lVar6) / 1.4142135623730951;
    *(undefined8 *)((long)&inp->im + lVar6 * 2) = 0;
  }
  pfVar7 = inp + lVar12;
  for (lVar6 = lVar12; lVar6 < (long)high_pass; lVar6 = lVar6 + 1) {
    pfVar7->re = 0.0;
    pfVar7->im = 0.0;
    pfVar7 = pfVar7 + 1;
  }
  fft_exec(obj,inp,oup);
  for (lVar6 = 0; uVar13 * 8 != lVar6; lVar6 = lVar6 + 8) {
    *(double *)((long)&inp->re + lVar6 * 2) =
         *(double *)((long)wt->wave->hpd + lVar6) / 1.4142135623730951;
    *(undefined8 *)((long)&inp->im + lVar6 * 2) = 0;
  }
  pfVar7 = inp + lVar12;
  for (; lVar12 < (long)high_pass; lVar12 = lVar12 + 1) {
    pfVar7->re = 0.0;
    pfVar7->im = 0.0;
    pfVar7 = pfVar7 + 1;
  }
  fft_exec(obj,inp,oup_00);
  conj_complex(oup,uVar11);
  conj_complex(oup_00,uVar11);
  exp2((double)iVar3 + -1.0);
  lVar12 = 0;
  uVar13 = 0;
  if (0 < (int)uVar11) {
    uVar13 = (ulong)uVar11;
  }
  for (; uVar13 * 8 != lVar12; lVar12 = lVar12 + 8) {
    *(undefined8 *)((long)&inp->re + lVar12 * 2) = *(undefined8 *)((long)wt->output + lVar12);
    *(undefined8 *)((long)&inp->im + lVar12 * 2) = 0;
    puVar1 = (undefined8 *)((long)&det->re + lVar12 * 2);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  getMODWTRecCoeff(obj,fft_bd,inp,det,cA,cD,index,"appx",iVar3,(int)oup,oup_00,high_pass,
                   in_stack_ffffffffffffff58);
  uVar11 = wt->siglength;
  lVar12 = 0;
  uVar9 = 0;
  if (0 < (int)uVar11) {
    uVar9 = (ulong)uVar11;
  }
  for (; uVar9 * 8 != lVar12; lVar12 = lVar12 + 8) {
    *(undefined8 *)((long)pdVar5 + lVar12) = *(undefined8 *)((long)&inp->re + lVar12 * 2);
  }
  iVar10 = 0;
  iVar8 = 0;
  if (0 < iVar3) {
    iVar8 = iVar3;
  }
  lVar12 = (long)high_pass * 8;
  for (; iVar10 != iVar8; iVar10 = iVar10 + 1) {
    for (lVar6 = 0; uVar13 * 8 != lVar6; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)&inp->re + lVar6 * 2) =
           *(undefined8 *)((long)wt->output + lVar6 + lVar12);
      *(undefined8 *)((long)&inp->im + lVar6 * 2) = 0;
      puVar1 = (undefined8 *)((long)&det->re + lVar6 * 2);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    getMODWTRecCoeff(obj,fft_bd,inp,det,cA,cD,index,"det",iVar3 - iVar10,(int)oup,oup_00,high_pass,
                     in_stack_ffffffffffffff58);
    uVar2 = wt->siglength;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (lVar6 = 0; uVar9 * 8 != lVar6; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)pdVar5 + lVar6 + (long)(int)uVar11 * 8) =
           *(undefined8 *)((long)&inp->re + lVar6 * 2);
    }
    uVar11 = uVar11 + uVar2;
    lVar12 = lVar12 + (long)high_pass * 8;
  }
  free(det);
  free(index);
  free(inp);
  free(cA);
  free(cD);
  free(oup);
  free(oup_00);
  free_fft(obj);
  free_fft(fft_bd);
  return pdVar5;
}

Assistant:

double* getMODWTmra(wt_object wt, double *wavecoeffs) {
	double *mra;
	int i, J, temp_len, iter, M, N, len_avg,lmra;
	int lenacc;
	double s;
	fft_data  *cA, *cD, *low_pass, *high_pass, *sig,*ninp;
	int *index;
	fft_object fft_fd = NULL;
	fft_object fft_bd = NULL;

	N = wt->modwtsiglength;
	len_avg = wt->wave->lpd_len;
	if (!strcmp(wt->ext, "sym")) {
		temp_len = N / 2;
	}
	else if (!strcmp(wt->ext, "per")) {
		temp_len = N;
	}
	J = wt->J;

	s = sqrt(2.0);
	fft_fd = fft_init(N, 1);
	fft_bd = fft_init(N, -1);

	sig = (fft_data*)malloc(sizeof(fft_data)* N);
	cA = (fft_data*)malloc(sizeof(fft_data)* N);
	cD = (fft_data*)malloc(sizeof(fft_data)* N);
	ninp = (fft_data*)malloc(sizeof(fft_data)* N);
	low_pass = (fft_data*)malloc(sizeof(fft_data)* N);
	high_pass = (fft_data*)malloc(sizeof(fft_data)* N);
	index = (int*)malloc(sizeof(int)*N);
	mra = (double*)malloc(sizeof(double)*temp_len*(J + 1));

	// N-point FFT of low pass and high pass filters

	// Low Pass Filter

	for (i = 0; i < len_avg; ++i) {
		sig[i].re = (fft_type)wt->wave->lpd[i] / s;
		sig[i].im = 0.0;
	}
	for (i = len_avg; i < N; ++i) {
		sig[i].re = 0.0;
		sig[i].im = 0.0;
	}


	fft_exec(fft_fd, sig, low_pass);

	// High Pass Filter

	for (i = 0; i < len_avg; ++i) {
		sig[i].re = (fft_type)wt->wave->hpd[i] / s;
		sig[i].im = 0.0;
	}
	for (i = len_avg; i < N; ++i) {
		sig[i].re = 0.0;
		sig[i].im = 0.0;
	}

	fft_exec(fft_fd, sig, high_pass);


	// Complex conjugate of the two filters

	conj_complex(low_pass, N);
	conj_complex(high_pass, N);

	M = (int)pow(2.0, (double)J - 1.0);
	lenacc = N;

	// 
	for (i = 0; i < N; ++i) {
		sig[i].re = (fft_type)wt->output[i];
		sig[i].im = 0.0;
		ninp[i].re = 0.0;
		ninp[i].im = 0.0;
	}

	// Find Approximation MRA

	getMODWTRecCoeff(fft_fd,fft_bd,sig,ninp,cA,cD,index,"appx",J,J,low_pass,high_pass,N);

	for (i = 0; i < wt->siglength; ++i) {
		mra[i] = sig[i].re;
	}
	lmra = wt->siglength;
	// Find Details MRA

	for (iter = 0; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			sig[i].re = (fft_type)wt->output[lenacc+i];
			sig[i].im = 0.0;
			ninp[i].re = 0.0;
			ninp[i].im = 0.0;
		}

		getMODWTRecCoeff(fft_fd, fft_bd, sig, ninp,cA, cD, index, "det", J-iter, J, low_pass, high_pass, N);

		for (i = 0; i < wt->siglength; ++i) {
			mra[lmra+i] = sig[i].re;
		}

		lenacc += N;
		lmra += wt->siglength;
	}

	free(ninp);
	free(index);
	free(sig);
	free(cA);
	free(cD);
	free(low_pass);
	free(high_pass);
	free_fft(fft_fd);
	free_fft(fft_bd);

	return mra;
}